

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

ssl_ticket_aead_result_t
bssl::ssl_process_ticket
          (SSL_HANDSHAKE *hs,UniquePtr<SSL_SESSION> *out_session,bool *out_renew_ticket,
          Span<const_unsigned_char> ticket,Span<const_unsigned_char> session_id)

{
  SSL *ssl;
  SSL_HANDSHAKE_HINTS *pSVar1;
  ssl_ctx_st *psVar2;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *this;
  undefined8 __p;
  bool bVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ssl_ticket_aead_result_t sVar7;
  int iVar8;
  size_t sVar9;
  ssl_ticket_aead_result_t sVar10;
  ptrdiff_t _Num;
  Span<const_unsigned_char> ticket_00;
  Span<const_unsigned_char> ticket_01;
  UniquePtr<SSL_SESSION> session;
  Array<unsigned_char> local_178;
  _Head_base<0UL,_ssl_session_st_*,_false> local_160;
  uchar *local_158;
  HMAC_CTX *local_150;
  Array<unsigned_char> *local_148;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *local_140;
  undefined1 local_138 [160];
  EVP_MD *local_98;
  
  local_158 = (uchar *)ticket.size_;
  ssl = hs->ssl;
  *out_renew_ticket = false;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session,(pointer)0x0);
  uVar5 = SSL_get_options(hs->ssl);
  if ((uVar5 >> 0xe & 1) != 0) {
    return ssl_ticket_aead_ignore_ticket;
  }
  if (0x20 < session_id.size_) {
    return ssl_ticket_aead_ignore_ticket;
  }
  local_150 = (HMAC_CTX *)ticket.data_;
  local_140 = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session;
  uVar4 = ssl_protocol_version(ssl);
  uVar6 = (uint)uVar4;
  local_148 = (Array<unsigned_char> *)CONCAT44(local_148._4_4_,uVar6);
  local_178.data_ = (uchar *)0x0;
  local_178.size_ = 0;
  pSVar1 = (hs->hints)._M_t.
           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
  if ((pSVar1 == (SSL_HANDSHAKE_HINTS *)0x0 || uVar6 < 0x304) ||
     ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) != 0)) {
LAB_0013b227:
    if ((uVar6 < 0x304 && pSVar1 != (SSL_HANDSHAKE_HINTS *)0x0) &&
       ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0)) {
      sVar9 = (pSVar1->decrypted_ticket).size_;
      if (sVar9 == 0) {
        if (((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) != 0) ||
           (sVar7 = ssl_ticket_aead_ignore_ticket, pSVar1->ignore_ticket == false))
        goto LAB_0013b2b3;
      }
      else {
        local_160._M_head_impl = (ssl_session_st *)(pSVar1->decrypted_ticket).data_;
        bVar3 = Array<unsigned_char>::InitUninitialized(&local_178,sVar9);
        sVar7 = ssl_ticket_aead_error;
        if (bVar3) {
          memmove(local_178.data_,local_160._M_head_impl,sVar9);
          *out_renew_ticket = pSVar1->renew_ticket;
          goto LAB_0013b294;
        }
      }
    }
    else {
LAB_0013b2b3:
      psVar2 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
      if (psVar2->ticket_aead_method == (SSL_TICKET_AEAD_METHOD *)0x0) {
        sVar7 = ssl_ticket_aead_ignore_ticket;
        if ((uchar *)0x1f < local_158) {
          if (psVar2->ticket_key_cb ==
              (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)0x0)
          {
            ticket_01.size_ = (size_t)local_158;
            ticket_01.data_ = (uchar *)local_150;
            sVar7 = ssl_decrypt_ticket_with_ticket_keys(hs,&local_178,ticket_01);
          }
          else {
            EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_138);
            HMAC_CTX_init((HMAC_CTX *)&stack0xffffffffffffff68);
            sVar9 = 0;
            iVar8 = (*((hs->ssl->session_ctx)._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_key_cb)
                              (hs->ssl,(uint8_t *)local_150,(uint8_t *)&(local_150->md_ctx).md_data,
                               (EVP_CIPHER_CTX *)local_138,(HMAC_CTX *)&stack0xffffffffffffff68,0);
            if (iVar8 < 0) {
              sVar7 = ssl_ticket_aead_error;
            }
            else if (iVar8 == 0) {
              sVar7 = ssl_ticket_aead_ignore_ticket;
            }
            else {
              if (iVar8 != 1) {
                if (iVar8 != 2) {
                  __assert_fail("cb_ret == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                                ,0x10e2,
                                "enum ssl_ticket_aead_result_t bssl::ssl_decrypt_ticket_with_cb(SSL_HANDSHAKE *, Array<uint8_t> *, bool *, Span<const uint8_t>)"
                               );
                }
                *out_renew_ticket = true;
              }
              ticket_00.size_ = sVar9;
              ticket_00.data_ = local_158;
              sVar7 = decrypt_ticket_with_cipher_ctx
                                ((bssl *)&local_178,(Array<unsigned_char> *)local_138,
                                 (EVP_CIPHER_CTX *)&stack0xffffffffffffff68,local_150,ticket_00);
            }
            HMAC_CTX_cleanup((HMAC_CTX *)&stack0xffffffffffffff68);
            EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_138);
          }
        }
      }
      else {
        local_138._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        local_138._8_8_ = (EVP_MD *)0x0;
        bVar3 = Array<unsigned_char>::InitUninitialized
                          ((Array<unsigned_char> *)local_138,(size_t)local_158);
        sVar7 = ssl_ticket_aead_error;
        if ((bVar3) &&
           (sVar7 = (*((hs->ssl->session_ctx)._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_aead_method
                      ->open)(hs->ssl,(uint8_t *)local_138._0_8_,(size_t *)&stack0xffffffffffffff68,
                              (size_t)local_158,(uint8_t *)local_150,(size_t)local_158),
           sVar7 == ssl_ticket_aead_success)) {
          if ((ulong)local_138._8_8_ < local_98) {
            abort();
          }
          local_138._8_8_ = local_98;
          OPENSSL_free(local_178.data_);
          local_178.data_ = (uchar *)local_138._0_8_;
          local_178.size_ = local_138._8_8_;
          local_138._0_8_ = (_Head_base<0UL,_ssl_session_st_*,_false>)0x0;
          local_138._8_8_ = (EVP_MD *)0x0;
          sVar7 = ssl_ticket_aead_success;
        }
        OPENSSL_free((void *)local_138._0_8_);
      }
    }
  }
  else {
    sVar9 = (pSVar1->decrypted_psk).size_;
    if (sVar9 == 0) {
      if (((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) != 0) ||
         (sVar7 = ssl_ticket_aead_ignore_ticket, pSVar1->ignore_psk == false)) goto LAB_0013b227;
    }
    else {
      local_160._M_head_impl = (ssl_session_st *)(pSVar1->decrypted_psk).data_;
      bVar3 = Array<unsigned_char>::InitUninitialized(&local_178,sVar9);
      sVar7 = ssl_ticket_aead_error;
      if (bVar3) {
        memmove(local_178.data_,local_160._M_head_impl,sVar9);
LAB_0013b294:
        sVar7 = ssl_ticket_aead_success;
      }
    }
  }
  sVar9 = local_178.size_;
  if ((pSVar1 != (SSL_HANDSHAKE_HINTS *)0x0) && ((hs->field_0x6ca & 0x10) != 0)) {
    if (sVar7 == ssl_ticket_aead_success) {
      local_160._M_head_impl = (ssl_session_st *)local_178.data_;
      if ((uint)local_148 < 0x304) {
        local_148 = &pSVar1->decrypted_ticket;
        bVar3 = Array<unsigned_char>::InitUninitialized(local_148,local_178.size_);
        if (bVar3 && (EVP_MD *)sVar9 != (EVP_MD *)0x0) {
          memmove(local_148->data_,local_160._M_head_impl,sVar9);
        }
        sVar10 = ssl_ticket_aead_error;
        if (!bVar3) goto LAB_0013b533;
        pSVar1->renew_ticket = *out_renew_ticket;
      }
      else {
        bVar3 = Array<unsigned_char>::InitUninitialized(&pSVar1->decrypted_psk,local_178.size_);
        if (bVar3 && (EVP_MD *)sVar9 != (EVP_MD *)0x0) {
          memmove((pSVar1->decrypted_psk).data_,local_160._M_head_impl,sVar9);
        }
        sVar10 = ssl_ticket_aead_error;
        if (!bVar3) goto LAB_0013b533;
      }
    }
    else {
      sVar10 = sVar7;
      if (sVar7 != ssl_ticket_aead_ignore_ticket) goto LAB_0013b533;
      if ((uint)local_148 < 0x304) {
        pSVar1->ignore_ticket = true;
      }
      else {
        pSVar1->ignore_psk = true;
      }
    }
  }
  sVar10 = sVar7;
  if (sVar7 == ssl_ticket_aead_success) {
    local_138._0_8_ =
         SSL_SESSION_from_bytes
                   (local_178.data_,local_178.size_,
                    (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    this = local_140;
    if ((tuple<ssl_session_st_*,_bssl::internal::Deleter>)local_138._0_8_ ==
        (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
      sVar10 = ssl_ticket_aead_ignore_ticket;
      ERR_clear_error();
    }
    else {
      (((ssl_session_st *)local_138._0_8_)->session_id).size_ = ' ';
      SHA256((uchar *)local_150,(size_t)local_158,
             (uchar *)&((ssl_session_st *)local_138._0_8_)->session_id);
      __p = local_138._0_8_;
      local_138._0_8_ = (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
      std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset(this,(pointer)__p);
      sVar10 = ssl_ticket_aead_success;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_138);
  }
LAB_0013b533:
  OPENSSL_free(local_178.data_);
  return sVar10;
}

Assistant:

enum ssl_ticket_aead_result_t ssl_process_ticket(
    SSL_HANDSHAKE *hs, UniquePtr<SSL_SESSION> *out_session,
    bool *out_renew_ticket, Span<const uint8_t> ticket,
    Span<const uint8_t> session_id) {
  SSL *const ssl = hs->ssl;
  *out_renew_ticket = false;
  out_session->reset();

  if ((SSL_get_options(hs->ssl) & SSL_OP_NO_TICKET) ||
      session_id.size() > SSL_MAX_SSL_SESSION_ID_LENGTH) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Tickets in TLS 1.3 are tied into pre-shared keys (PSKs), unlike in TLS 1.2
  // where that concept doesn't exist. The |decrypted_psk| and |ignore_psk|
  // hints only apply to PSKs. We check the version to determine which this is.
  const bool is_psk = ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  Array<uint8_t> plaintext;
  enum ssl_ticket_aead_result_t result;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (is_psk && hints && !hs->hints_requested &&
      !hints->decrypted_psk.empty()) {
    result = plaintext.CopyFrom(hints->decrypted_psk) ? ssl_ticket_aead_success
                                                      : ssl_ticket_aead_error;
  } else if (is_psk && hints && !hs->hints_requested && hints->ignore_psk) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (!is_psk && hints && !hs->hints_requested &&
             !hints->decrypted_ticket.empty()) {
    if (plaintext.CopyFrom(hints->decrypted_ticket)) {
      result = ssl_ticket_aead_success;
      *out_renew_ticket = hints->renew_ticket;
    } else {
      result = ssl_ticket_aead_error;
    }
  } else if (!is_psk && hints && !hs->hints_requested && hints->ignore_ticket) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (ssl->session_ctx->ticket_aead_method != NULL) {
    result = ssl_decrypt_ticket_with_method(hs, &plaintext, out_renew_ticket,
                                            ticket);
  } else {
    // Ensure there is room for the key name and the largest IV |ticket_key_cb|
    // may try to consume. The real limit may be lower, but the maximum IV
    // length should be well under the minimum size for the session material and
    // HMAC.
    if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + EVP_MAX_IV_LENGTH) {
      result = ssl_ticket_aead_ignore_ticket;
    } else if (ssl->session_ctx->ticket_key_cb != NULL) {
      result =
          ssl_decrypt_ticket_with_cb(hs, &plaintext, out_renew_ticket, ticket);
    } else {
      result = ssl_decrypt_ticket_with_ticket_keys(hs, &plaintext, ticket);
    }
  }

  if (hints && hs->hints_requested) {
    if (result == ssl_ticket_aead_ignore_ticket) {
      if (is_psk) {
        hints->ignore_psk = true;
      } else {
        hints->ignore_ticket = true;
      }
    } else if (result == ssl_ticket_aead_success) {
      if (is_psk) {
        if (!hints->decrypted_psk.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
      } else {
        if (!hints->decrypted_ticket.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
        hints->renew_ticket = *out_renew_ticket;
      }
    }
  }

  if (result != ssl_ticket_aead_success) {
    return result;
  }

  // Decode the session.
  UniquePtr<SSL_SESSION> session(SSL_SESSION_from_bytes(
      plaintext.data(), plaintext.size(), ssl->ctx.get()));
  if (!session) {
    ERR_clear_error();  // Don't leave an error on the queue.
    return ssl_ticket_aead_ignore_ticket;
  }

  // Envoy's tests expect the session to have a session ID that matches the
  // placeholder used by the client. It's unclear whether this is a good idea,
  // but we maintain it for now.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(ticket.data(), ticket.size(), session->session_id.data());

  *out_session = std::move(session);
  return ssl_ticket_aead_success;
}